

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.hpp
# Opt level: O2

void __thiscall
ylt::metric::basic_dynamic_counter<long,_(unsigned_char)'\x01'>::basic_dynamic_counter
          (basic_dynamic_counter<long,_(unsigned_char)__x01_> *this,string *name,string *help,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
          *labels_name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string(&local_48,name);
  std::__cxx11::string::string(&local_68,help);
  std::__cxx11::string::string(&bStack_88,labels_name->_M_elems);
  dynamic_metric_impl<std::atomic<long>,(unsigned_char)1>::metric_t<1ul>
            ((dynamic_metric_impl<std::atomic<long>,(unsigned_char)1> *)this,Counter,&local_48,
             &local_68,
             (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
              *)&bStack_88);
  std::__cxx11::string::~string((string *)&bStack_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x01_>).super_dynamic_metric.
  super_metric_t._vptr_metric_t = (_func_int **)&PTR__dynamic_metric_impl_001e7e58;
  return;
}

Assistant:

basic_dynamic_counter(std::string name, std::string help,
                        std::array<std::string, N> labels_name)
      : Base(MetricType::Counter, std::move(name), std::move(help),
             std::move(labels_name)) {}